

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::ParseTextMap(UDMFParser *this,MapData *map)

{
  uint *puVar1;
  FMapThingUserData *pFVar2;
  uint uVar3;
  FileReader *pFVar4;
  vertex_t *pvVar5;
  vertexdata_t *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint key;
  bool bVar10;
  int iVar11;
  char *pcVar12;
  char *name;
  FMapThing *pFVar13;
  Node *pNVar14;
  line_t_conflict *plVar15;
  ulong uVar16;
  sector_t_conflict *__dest;
  ulong *puVar17;
  long lVar18;
  long lVar19;
  undefined8 *puVar20;
  short *psVar21;
  uint32_t *puVar22;
  size_t sVar23;
  size_t __n;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  intmapsidedef_t st;
  FMapThing th;
  intmapsidedef_t local_298;
  TArray<vertexdata_t,_vertexdata_t> *local_280;
  TArray<vertex_t,_vertex_t> *local_278;
  TArray<sector_t,_sector_t> *local_270;
  TArray<intmapsidedef_t,_intmapsidedef_t> *local_268;
  TArray<side_t,_side_t> *local_260;
  char *local_258;
  TArray<line_t,_line_t> *local_250;
  undefined1 local_248 [104];
  anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1 local_1e0;
  double local_1d8;
  sector_t_conflict *local_1d0;
  DAngle DStack_1c8;
  int local_1c0;
  FTextureID local_1b8;
  
  bVar26 = 0;
  pFVar4 = map->MapLumps[1].Reader;
  iVar11 = 0;
  if (pFVar4 == (FileReader *)0x0) {
    uVar16 = 0;
  }
  else {
    uVar16 = (ulong)(uint)pFVar4->Length;
  }
  pcVar12 = (char *)operator_new__(uVar16);
  this->isTranslated = true;
  this->isExtended = false;
  this->floordrop = false;
  lVar18 = pFVar4->Length;
  map->file = pFVar4;
  (*(pFVar4->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar4,0,0);
  (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,pcVar12,(long)(int)lVar18);
  name = FWadCollection::GetLumpFullName(&Wads,map->lumpnum);
  pFVar4 = map->MapLumps[1].Reader;
  if (pFVar4 != (FileReader *)0x0) {
    iVar11 = (int)pFVar4->Length;
  }
  FScanner::OpenMem((FScanner *)this,name,pcVar12,iVar11);
  operator_delete__(pcVar12);
  FScanner::SetCMode((FScanner *)this,true);
  bVar10 = FScanner::CheckString((FScanner *)this,"namespace");
  if (!bVar10) {
    Printf("Map does not define a namespace.\n");
    goto LAB_00460a37;
  }
  FScanner::MustGetStringName((FScanner *)this,"=");
  FScanner::MustGetString((FScanner *)this);
  iVar11 = FName::NameManager::FindName
                     (&FName::NameData,(this->super_UDMFParserBase).sc.String,false);
  (this->super_UDMFParserBase).namespc.Index = iVar11;
  if (iVar11 < 0x18c) {
    switch(iVar11) {
    case 8:
      (this->super_UDMFParserBase).namespace_bits = 1;
      pcVar12 = "xlat/doom_base.txt";
      break;
    case 9:
      (this->super_UDMFParserBase).namespace_bits = 2;
      pcVar12 = "xlat/heretic_base.txt";
      break;
    case 10:
switchD_004608d9_caseD_a:
      (this->super_UDMFParserBase).namespace_bits = 4;
      goto LAB_004609df;
    case 0xb:
      (this->super_UDMFParserBase).namespace_bits = 8;
      P_LoadTranslator("xlat/strife_base.txt");
      level.flags2._2_1_ = level.flags2._2_1_ | 0x60;
      goto LAB_0046097c;
    default:
switchD_004608d9_default:
      Printf("Unknown namespace %s. Using defaults for %s\n",(this->super_UDMFParserBase).sc.String,
             GameNames[gameinfo.gametype]);
      if (gameinfo.gametype == GAME_Heretic) {
        (this->super_UDMFParserBase).namespace_bits = 2;
        pcVar12 = "xlat/heretic_base.txt";
      }
      else {
        if (gameinfo.gametype == GAME_Hexen) goto switchD_004608d9_caseD_a;
        if (gameinfo.gametype == GAME_Strife) {
          (this->super_UDMFParserBase).namespace_bits = 8;
          pcVar12 = "xlat/strife_base.txt";
        }
        else {
          (this->super_UDMFParserBase).namespace_bits = 1;
          pcVar12 = "xlat/doom_base.txt";
        }
      }
      P_LoadTranslator(pcVar12);
      goto LAB_00460a28;
    }
    P_LoadTranslator(pcVar12);
    level.flags2._2_1_ = level.flags2._2_1_ | 0x40;
LAB_0046097c:
    this->floordrop = true;
  }
  else {
    if (iVar11 == 0x18e) {
      (this->super_UDMFParserBase).namespace_bits = 0x40;
    }
    else {
      if (iVar11 == 0x18d) {
        level.flags2._2_1_ = level.flags2._2_1_ | 0x40;
        (this->super_UDMFParserBase).namespace_bits = 0x20;
        goto LAB_00460a28;
      }
      if (iVar11 != 0x18c) goto switchD_004608d9_default;
      (this->super_UDMFParserBase).namespace_bits = 0x10;
    }
LAB_004609df:
    this->isTranslated = false;
  }
LAB_00460a28:
  FScanner::MustGetStringName((FScanner *)this,";");
LAB_00460a37:
  bVar10 = FScanner::GetString((FScanner *)this);
  if (bVar10) {
    local_278 = &this->ParsedVertices;
    local_280 = &this->ParsedVertexDatas;
    local_270 = &this->ParsedSectors;
    local_260 = &this->ParsedSides;
    local_268 = &this->ParsedSideTextures;
    local_250 = &this->ParsedLines;
    local_258 = FString::NullString.Nothing;
    do {
      bVar10 = FScanner::Compare((FScanner *)this,"thing");
      uVar3 = MapThingsUserData.Count;
      if (bVar10) {
        ParseThing(this,(FMapThing *)local_248);
        TArray<FMapThing,_FMapThing>::Grow(&MapThingsConverted,1);
        pFVar13 = MapThingsConverted.Array + MapThingsConverted.Count;
        pFVar13->thingid = local_248._0_4_;
        (pFVar13->pos).X = (double)local_248._8_8_;
        (pFVar13->pos).Y = (double)local_248._16_8_;
        (pFVar13->pos).Z = (double)local_248._24_8_;
        puVar20 = (undefined8 *)(local_248 + 0x20);
        psVar21 = &pFVar13->angle;
        for (lVar18 = 8; lVar18 != 0; lVar18 = lVar18 + -1) {
          *(undefined8 *)psVar21 = *puVar20;
          puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
          psVar21 = psVar21 + ((ulong)bVar26 * -2 + 1) * 4;
        }
        pFVar13->fillcolor = local_248._96_4_;
        (pFVar13->Scale).X = (double)local_1e0;
        (pFVar13->Scale).Y = local_1d8;
        *(sector_t_conflict **)&pFVar13->health = local_1d0;
        *(double *)&pFVar13->pitch = DStack_1c8.Degrees;
        pFVar13->FloatbobPhase = local_1c0;
        key = MapThingsConverted.Count;
        MapThingsConverted.Count = MapThingsConverted.Count + 1;
        if (uVar3 < MapThingsUserData.Count) {
          pNVar14 = TMap<unsigned_int,_unsigned_int,_THashTraits<unsigned_int>,_TValueTraits<unsigned_int>_>
                    ::GetNode(&MapThingsUserDataIndex,key);
          (pNVar14->Pair).Value = uVar3;
          TArray<FMapThingUserData,_FMapThingUserData>::Grow(&MapThingsUserData,1);
          pFVar2 = MapThingsUserData.Array + MapThingsUserData.Count;
          pFVar2->Property = 0;
          pFVar2->Value = 0;
          MapThingsUserData.Count = MapThingsUserData.Count + 1;
        }
      }
      else {
        bVar10 = FScanner::Compare((FScanner *)this,"linedef");
        if (bVar10) {
          ParseLinedef(this,(line_t_conflict *)local_248,(this->ParsedLines).Count);
          TArray<line_t,_line_t>::Grow(local_250,1);
          plVar15 = (this->ParsedLines).Array + (this->ParsedLines).Count;
          plVar15->v1 = (vertex_t *)CONCAT44(local_248._4_4_,local_248._0_4_);
          plVar15->v2 = (vertex_t *)local_248._8_8_;
          (plVar15->delta).X = (double)local_248._16_8_;
          (plVar15->delta).Y = (double)local_248._24_8_;
          puVar20 = (undefined8 *)(local_248 + 0x20);
          puVar22 = &plVar15->flags;
          for (lVar18 = 0xe; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(undefined8 *)puVar22 = *puVar20;
            puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
            puVar22 = puVar22 + ((ulong)bVar26 * -2 + 1) * 2;
          }
          plVar15->portalindex = local_1b8.texnum;
          puVar1 = &(this->ParsedLines).Count;
          *puVar1 = *puVar1 + 1;
        }
        else {
          bVar10 = FScanner::Compare((FScanner *)this,"sidedef");
          if (bVar10) {
            local_298.toptexture.Chars = local_258;
            local_298.bottomtexture.Chars = local_258;
            local_298.midtexture.Chars = local_258;
            FString::NullString.RefCount = FString::NullString.RefCount + 3;
            ParseSidedef(this,(side_t *)local_248,&local_298,(this->ParsedSides).Count);
            TArray<side_t,_side_t>::Push(local_260,(side_t *)local_248);
            TArray<intmapsidedef_t,_intmapsidedef_t>::Push(local_268,&local_298);
            FString::~FString(&local_298.midtexture);
            FString::~FString(&local_298.bottomtexture);
            FString::~FString(&local_298.toptexture);
          }
          else {
            bVar10 = FScanner::Compare((FScanner *)this,"sector");
            if (bVar10) {
              ParseSector(this,(sector_t_conflict *)local_248,(this->ParsedSectors).Count);
              TArray<sector_t,_sector_t>::Push(local_270,(sector_t_conflict *)local_248);
            }
            else {
              bVar10 = FScanner::Compare((FScanner *)this,"vertex");
              if (bVar10) {
                ParseVertex(this,(vertex_t *)&local_298,(vertexdata_t *)local_248);
                TArray<vertex_t,_vertex_t>::Grow(local_278,1);
                pvVar5 = (this->ParsedVertices).Array;
                uVar3 = (this->ParsedVertices).Count;
                pvVar5[uVar3].p.X = (double)local_298.toptexture.Chars;
                pvVar5[uVar3].p.Y = (double)local_298.bottomtexture.Chars;
                (this->ParsedVertices).Count = uVar3 + 1;
                TArray<vertexdata_t,_vertexdata_t>::Grow(local_280,1);
                pvVar6 = (this->ParsedVertexDatas).Array;
                uVar3 = (this->ParsedVertexDatas).Count;
                *(undefined8 *)&pvVar6[uVar3].flags = local_248._16_8_;
                pvVar6 = pvVar6 + uVar3;
                pvVar6->zCeiling = (double)CONCAT44(local_248._4_4_,local_248._0_4_);
                pvVar6->zFloor = (double)local_248._8_8_;
                puVar1 = &(this->ParsedVertexDatas).Count;
                *puVar1 = *puVar1 + 1;
              }
              else {
                UDMFParserBase::Skip(&this->super_UDMFParserBase);
              }
            }
          }
        }
      }
      bVar10 = FScanner::GetString((FScanner *)this);
    } while (bVar10);
  }
  if ((this->ParsedVertices).Count == 0) {
    I_Error("Map has no vertices.\n");
  }
  if ((this->ParsedSectors).Count == 0) {
    I_Error("Map has no sectors. \n");
  }
  if ((this->ParsedLines).Count == 0) {
    I_Error("Map has no linedefs.\n");
  }
  if ((this->ParsedSides).Count == 0) {
    I_Error("Map has no sidedefs.\n");
  }
  numvertexes = (this->ParsedVertices).Count;
  __n = (long)numvertexes << 4;
  sVar23 = __n;
  if ((long)numvertexes < 0) {
    sVar23 = 0xffffffffffffffff;
  }
  vertexes = (vertex_t *)operator_new__(sVar23);
  memcpy(vertexes,(this->ParsedVertices).Array,__n);
  numvertexdatas = (this->ParsedVertexDatas).Count;
  uVar24 = (ulong)numvertexdatas;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar24;
  uVar16 = SUB168(auVar7 * ZEXT816(0x18),0);
  if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  vertexdatas = (vertexdata_t *)operator_new__(uVar16);
  memcpy(vertexdatas,(this->ParsedVertexDatas).Array,uVar24 * 0x18);
  uVar3 = (this->ParsedSectors).Count;
  uVar24 = (ulong)(int)uVar3;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar24;
  uVar16 = SUB168(auVar8 * ZEXT816(0xa0),0) | 8;
  if (SUB168(auVar8 * ZEXT816(0xa0),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar24;
  uVar25 = 0xffffffffffffffff;
  if (SUB168(auVar9 * ZEXT816(0x218),8) == 0) {
    uVar25 = SUB168(auVar9 * ZEXT816(0x218),0);
  }
  numsectors = uVar3;
  __dest = (sector_t_conflict *)operator_new__(uVar25);
  sectors = __dest;
  memcpy(__dest,(this->ParsedSectors).Array,uVar24 * 0x218);
  puVar17 = (ulong *)operator_new__(uVar16);
  *puVar17 = uVar24;
  if (uVar3 != 0) {
    memset((extsector_t *)(puVar17 + 1),0,((uVar24 * 0xa0 - 0xa0) / 0xa0) * 0xa0 + 0xa0);
  }
  __dest->e = (extsector_t *)(puVar17 + 1);
  if (0 < (int)uVar3) {
    lVar18 = 0x210;
    lVar19 = 0;
    do {
      *(long *)((long)&sectors->planes[0].xform.xOffs + lVar18) =
           (long)&(sectors->e->FakeFloor).Sectors.Array + lVar19;
      lVar19 = lVar19 + 0xa0;
      lVar18 = lVar18 + 0x218;
    } while (uVar24 * 0xa0 != lVar19);
  }
  ProcessLineDefs(this);
  return;
}

Assistant:

void ParseTextMap(MapData *map)
	{
		char *buffer = new char[map->Size(ML_TEXTMAP)];

		isTranslated = true;
		isExtended = false;
		floordrop = false;

		map->Read(ML_TEXTMAP, buffer);
		sc.OpenMem(Wads.GetLumpFullName(map->lumpnum), buffer, map->Size(ML_TEXTMAP));
		delete [] buffer;
		sc.SetCMode(true);
		if (sc.CheckString("namespace"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			namespc = sc.String;
			switch(namespc)
			{
			case NAME_ZDoom:
				namespace_bits = Zd;
				isTranslated = false;
				break;
			case NAME_ZDoomTranslated:
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				namespace_bits = Zdt;
				break;
			case NAME_Vavoom:
				namespace_bits = Va;
				isTranslated = false;
				break;
			case NAME_Hexen:
				namespace_bits = Hx;
				isTranslated = false;
				break;
			case NAME_Doom:
				namespace_bits = Dm;
				P_LoadTranslator("xlat/doom_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Heretic:
				namespace_bits = Ht;
				P_LoadTranslator("xlat/heretic_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES;
				floordrop = true;
				break;
			case NAME_Strife:
				namespace_bits = St;
				P_LoadTranslator("xlat/strife_base.txt");
				level.flags2 |= LEVEL2_DUMMYSWITCHES|LEVEL2_RAILINGHACK;
				floordrop = true;
				break;
			default:
				Printf("Unknown namespace %s. Using defaults for %s\n", sc.String, GameTypeName());
				switch (gameinfo.gametype)
				{
				default:			// Shh, GCC
				case GAME_Doom:
				case GAME_Chex:
					namespace_bits = Dm;
					P_LoadTranslator("xlat/doom_base.txt");
					break;
				case GAME_Heretic:
					namespace_bits = Ht;
					P_LoadTranslator("xlat/heretic_base.txt");
					break;
				case GAME_Strife:
					namespace_bits = St;
					P_LoadTranslator("xlat/strife_base.txt");
					break;
				case GAME_Hexen:
					namespace_bits = Hx;
					isTranslated = false;
					break;
				}
			}
			sc.MustGetStringName(";");
		}
		else
		{
			Printf("Map does not define a namespace.\n");
		}

		while (sc.GetString())
		{
			if (sc.Compare("thing"))
			{
				FMapThing th;
				unsigned userdatastart = MapThingsUserData.Size();
				ParseThing(&th);
				MapThingsConverted.Push(th);
				if (userdatastart < MapThingsUserData.Size())
				{ // User data added
					MapThingsUserDataIndex[MapThingsConverted.Size()-1] = userdatastart;
					// Mark end of the user data for this map thing
					FMapThingUserData ud;
					ud.Property = NAME_None;
					ud.Value = 0;
					MapThingsUserData.Push(ud);
				}
			}
			else if (sc.Compare("linedef"))
			{
				line_t li;
				ParseLinedef(&li, ParsedLines.Size());
				ParsedLines.Push(li);
			}
			else if (sc.Compare("sidedef"))
			{
				side_t si;
				intmapsidedef_t st;
				ParseSidedef(&si, &st, ParsedSides.Size());
				ParsedSides.Push(si);
				ParsedSideTextures.Push(st);
			}
			else if (sc.Compare("sector"))
			{
				sector_t sec;
				ParseSector(&sec, ParsedSectors.Size());
				ParsedSectors.Push(sec);
			}
			else if (sc.Compare("vertex"))
			{
				vertex_t vt;
				vertexdata_t vd;
				ParseVertex(&vt, &vd);
				ParsedVertices.Push(vt);
				ParsedVertexDatas.Push(vd);
			}
			else
			{
				Skip();
			}
		}

		// Catch bogus maps here rather than during nodebuilding
		if (ParsedVertices.Size() == 0)	I_Error("Map has no vertices.\n");
		if (ParsedSectors.Size() == 0)	I_Error("Map has no sectors. \n");
		if (ParsedLines.Size() == 0)	I_Error("Map has no linedefs.\n");
		if (ParsedSides.Size() == 0)	I_Error("Map has no sidedefs.\n");

		// Create the real vertices
		numvertexes = ParsedVertices.Size();
		vertexes = new vertex_t[numvertexes];
		memcpy(vertexes, &ParsedVertices[0], numvertexes * sizeof(*vertexes));

		// Create the real vertex datas
		numvertexdatas = ParsedVertexDatas.Size();
		vertexdatas = new vertexdata_t[numvertexdatas];
		memcpy(vertexdatas, &ParsedVertexDatas[0], numvertexdatas * sizeof(*vertexdatas));

		// Create the real sectors
		numsectors = ParsedSectors.Size();
		sectors = new sector_t[numsectors];
		memcpy(sectors, &ParsedSectors[0], numsectors * sizeof(*sectors));
		sectors[0].e = new extsector_t[numsectors];
		for(int i = 0; i < numsectors; i++)
		{
			sectors[i].e = &sectors[0].e[i];
		}

		// Create the real linedefs and decompress the sidedefs
		ProcessLineDefs();
	}